

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_SetPropertyValue(JSContext *ctx,JSValue this_obj,JSValue prop,JSValue val,int flags)

{
  uint16_t uVar1;
  int iVar2;
  long lVar3;
  JSContext *ctx_00;
  JSAtom prop_00;
  int iVar4;
  JSObject *pJVar5;
  uint uVar6;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  long lVar9;
  JSRuntime *rt;
  undefined4 in_register_0000008c;
  JSValueUnion JVar10;
  uint uVar11;
  JSRefCountHeader *p;
  JSValue v;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  double d;
  int32_t local_44;
  JSValueUnion local_40;
  JSContext *local_38;
  
  JVar10._4_4_ = in_register_0000008c;
  JVar10.int32 = flags;
  JVar7 = prop.u;
  JVar8 = this_obj.u;
  uVar6 = val.u._0_4_;
  if (((int)this_obj.tag != -1) ||
     (((undefined1  [16])prop & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0))
  goto switchD_0011ee87_caseD_9;
  uVar11 = prop.u._0_4_;
  switch(*(short *)((long)JVar8.ptr + 6)) {
  case 8:
    if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) {
LAB_0011eff1:
      lVar3 = *(long *)((long)JVar8.ptr + 0x38);
      lVar9 = ((ulong)JVar7.ptr & 0xffffffff) * 0x10;
      JVar7 = (JSValueUnion)((JSValueUnion *)(lVar3 + lVar9))->ptr;
      JVar8 = *(JSValueUnion *)(lVar3 + 8 + lVar9);
      *(JSValueUnion *)&((JSValueUnion *)(lVar3 + lVar9))->int32 = JVar10;
      *(JSValueUnion *)(lVar3 + 8 + lVar9) = val.u;
      iVar4 = 1;
      if ((uint)JVar8.int32 < 0xfffffff5) {
        return 1;
      }
      iVar2 = *JVar7.ptr;
      *(int *)JVar7.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return 1;
      }
      rt = ctx->rt;
      goto LAB_0011f030;
    }
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0011ee87_caseD_9:
    local_38 = ctx;
    prop_00 = JS_ValueToAtom(ctx,prop);
    if ((0xfffffff4 < (uint)prop.tag) &&
       (iVar4 = *JVar7.ptr, *(int *)JVar7.ptr = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(local_38->rt,prop);
    }
    ctx_00 = local_38;
    if (prop_00 != 0) {
      val_07.tag = (int64_t)val.u.ptr;
      val_07.u.float64 = JVar10.float64;
      iVar4 = JS_SetPropertyInternal(local_38,this_obj,prop_00,val_07,(int)val.tag);
      JS_FreeAtom(ctx_00,prop_00);
      return iVar4;
    }
    iVar4 = -1;
    if (uVar6 < 0xfffffff5) {
      return -1;
    }
    iVar2 = *JVar10.ptr;
    *(int *)JVar10.ptr = iVar2 + -1;
    if (1 < iVar2) {
      return -1;
    }
    rt = local_38->rt;
    JVar8 = val.u;
    JVar7 = JVar10;
LAB_0011f030:
    v.tag = (int64_t)JVar8.ptr;
    v.u.float64 = JVar7.float64;
    __JS_FreeValueRT(rt,v);
    return iVar4;
  case 0x15:
    val_03.tag = (int64_t)val.u.ptr;
    val_03.u.float64 = JVar10.float64;
    iVar4 = JS_ToUint8ClampFree(ctx,&local_44,val_03);
    goto LAB_0011efc1;
  case 0x16:
  case 0x17:
    val_00.tag = (int64_t)val.u.ptr;
    val_00.u.float64 = JVar10.float64;
    iVar4 = JS_ToInt32Free(ctx,&local_44,val_00);
LAB_0011efc1:
    if (iVar4 != 0) {
      return -1;
    }
    if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) {
      *(undefined1 *)(*(long *)((long)JVar8.ptr + 0x38) + ((ulong)JVar7.ptr & 0xffffffff)) =
           (undefined1)local_44;
      return 1;
    }
    break;
  case 0x18:
  case 0x19:
    val_02.tag = (int64_t)val.u.ptr;
    val_02.u.float64 = JVar10.float64;
    iVar4 = JS_ToInt32Free(ctx,&local_44,val_02);
    if (iVar4 != 0) {
      return -1;
    }
    if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) {
      *(undefined2 *)(*(long *)((long)JVar8.ptr + 0x38) + ((ulong)JVar7.ptr & 0xffffffff) * 2) =
           (undefined2)local_44;
      return 1;
    }
    break;
  case 0x1a:
  case 0x1b:
    val_01.tag = (int64_t)val.u.ptr;
    val_01.u.float64 = JVar10.float64;
    iVar4 = JS_ToInt32Free(ctx,&local_44,val_01);
    if (iVar4 != 0) {
      return -1;
    }
    if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) {
      *(int32_t *)(*(long *)((long)JVar8.ptr + 0x38) + ((ulong)JVar7.ptr & 0xffffffff) * 4) =
           local_44;
      return 1;
    }
    break;
  case 0x1c:
    if (uVar6 < 3) {
      JVar10.float64 = (double)flags;
    }
    else if ((uVar6 != 7) &&
            (val_05.tag = (int64_t)val.u.ptr, val_05.u.float64 = JVar10.float64,
            iVar4 = __JS_ToFloat64Free(ctx,&local_40.float64,val_05), JVar10 = local_40, iVar4 != 0)
            ) {
      return -1;
    }
    local_40 = JVar10;
    if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) {
      *(float *)(*(long *)((long)JVar8.ptr + 0x38) + ((ulong)JVar7.ptr & 0xffffffff) * 4) =
           (float)local_40.float64;
      return 1;
    }
    break;
  case 0x1d:
    if (uVar6 < 3) {
      JVar10.float64 = (double)flags;
    }
    else if ((uVar6 != 7) &&
            (val_04.tag = (int64_t)val.u.ptr, val_04.u.float64 = JVar10.float64,
            iVar4 = __JS_ToFloat64Free(ctx,&local_40.float64,val_04), JVar10 = local_40, iVar4 != 0)
            ) {
      return -1;
    }
    local_40 = JVar10;
    if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) {
      ((JSValueUnion *)(*(long *)((long)JVar8.ptr + 0x38) + ((ulong)JVar7.ptr & 0xffffffff) * 8))->
      float64 = (double)local_40;
      return 1;
    }
    break;
  default:
    if (*(short *)((long)JVar8.ptr + 6) == 2) {
      if (uVar11 < *(uint *)((long)JVar8.ptr + 0x40)) goto LAB_0011eff1;
      if ((*(uint *)((long)JVar8.ptr + 0x40) == uVar11) &&
         ((~*(byte *)((long)JVar8.ptr + 5) & 9) == 0)) {
        pJVar5 = (*(JSShape **)((long)JVar8.ptr + 0x18))->proto;
        do {
          if (pJVar5 == (JSObject *)0x0) {
            val_06.tag = (int64_t)val.u.ptr;
            val_06.u.float64 = JVar10.float64;
            iVar4 = add_fast_array_element(ctx,(JSObject *)JVar8.ptr,val_06,(int)val.tag);
            return iVar4;
          }
          uVar1 = (pJVar5->field_0).header.dummy2;
          if (uVar1 == 1) {
            if (pJVar5->shape->has_small_array_index != '\0') break;
          }
          else if ((uVar1 != 2) || (((pJVar5->field_0).header.dummy1 & 8) == 0)) break;
          pJVar5 = pJVar5->shape->proto;
        } while( true );
      }
    }
    goto switchD_0011ee87_caseD_9;
  }
  iVar4 = JS_ThrowTypeErrorOrFalse(ctx,(int)val.tag,"out-of-bound numeric index");
  return iVar4;
}

Assistant:

static int JS_SetPropertyValue(JSContext *ctx, JSValueConst this_obj,
                               JSValue prop, JSValue val, int flags)
{
    if (likely(JS_VALUE_GET_TAG(this_obj) == JS_TAG_OBJECT &&
               JS_VALUE_GET_TAG(prop) == JS_TAG_INT)) {
        JSObject *p;
        uint32_t idx;
        double d;
        int32_t v;

        /* fast path for array access */
        p = JS_VALUE_GET_OBJ(this_obj);
        idx = JS_VALUE_GET_INT(prop);
        switch(p->class_id) {
        case JS_CLASS_ARRAY:
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
                JSObject *p1;
                JSShape *sh1;

                /* fast path to add an element to the array */
                if (idx != (uint32_t)p->u.array.count ||
                    !p->fast_array || !p->extensible)
                    goto slow_path;
                /* check if prototype chain has a numeric property */
                p1 = p->shape->proto;
                while (p1 != NULL) {
                    sh1 = p1->shape;
                    if (p1->class_id == JS_CLASS_ARRAY) {
                        if (unlikely(!p1->fast_array))
                            goto slow_path;
                    } else if (p1->class_id == JS_CLASS_OBJECT) {
                        if (unlikely(sh1->has_small_array_index))
                            goto slow_path;
                    } else {
                        goto slow_path;
                    }
                    p1 = sh1->proto;
                }
                /* add element */
                return add_fast_array_element(ctx, p, val, flags);
            }
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_ARGUMENTS:
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto slow_path;
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_UINT8C_ARRAY:
            if (JS_ToUint8ClampFree(ctx, &v, val))
                return -1;
            /* Note: the conversion can detach the typed array, so the
               array bound check must be done after */
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT8_ARRAY:
        case JS_CLASS_UINT8_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT16_ARRAY:
        case JS_CLASS_UINT16_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint16_ptr[idx] = v;
            break;
        case JS_CLASS_INT32_ARRAY:
        case JS_CLASS_UINT32_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint32_ptr[idx] = v;
            break;
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:
        case JS_CLASS_BIG_UINT64_ARRAY:
            /* XXX: need specific conversion function */
            {
                int64_t v;
                if (JS_ToBigInt64Free(ctx, &v, val))
                    return -1;
                if (unlikely(idx >= (uint32_t)p->u.array.count))
                    goto ta_out_of_bound;
                p->u.array.u.uint64_ptr[idx] = v;
            }
            break;
#endif
        case JS_CLASS_FLOAT32_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.float_ptr[idx] = d;
            break;
        case JS_CLASS_FLOAT64_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
            ta_out_of_bound:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
            }
            p->u.array.u.double_ptr[idx] = d;
            break;
        default:
            goto slow_path;
        }
        return TRUE;
    } else {
        JSAtom atom;
        int ret;
    slow_path:
        atom = JS_ValueToAtom(ctx, prop);
        JS_FreeValue(ctx, prop);
        if (unlikely(atom == JS_ATOM_NULL)) {
            JS_FreeValue(ctx, val);
            return -1;
        }
        ret = JS_SetPropertyInternal(ctx, this_obj, atom, val, flags);
        JS_FreeAtom(ctx, atom);
        return ret;
    }
}